

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_benchmarker.hpp
# Opt level: O2

TestDescriptor *
hayai::Benchmarker::RegisterTest
          (char *fixtureName,char *testName,size_t runs,size_t iterations,TestFactory *testFactory,
          TestParametersDescriptor *parameters)

{
  int iVar1;
  size_t sVar2;
  TestDescriptor *this;
  Benchmarker *pBVar3;
  bool isDisabled;
  TestParametersDescriptor local_50;
  TestDescriptor *descriptor;
  
  sVar2 = strlen(testName);
  if (sVar2 < 9) {
    isDisabled = false;
  }
  else {
    iVar1 = bcmp(testName,RegisterTest::disabledPrefix,9);
    isDisabled = iVar1 == 0;
    testName = testName + (ulong)isDisabled * 9;
  }
  this = (TestDescriptor *)operator_new(0x98);
  inja::std::vector<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
  ::vector(&local_50._parameters,&parameters->_parameters);
  TestDescriptor::TestDescriptor
            (this,fixtureName,testName,runs,iterations,testFactory,&local_50,isDisabled);
  inja::std::vector<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
  ::~vector(&local_50._parameters);
  descriptor = this;
  pBVar3 = Instance();
  inja::std::vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>::push_back
            (&pBVar3->_tests,&descriptor);
  return descriptor;
}

Assistant:

static TestDescriptor* RegisterTest(
            const char* fixtureName,
            const char* testName,
            std::size_t runs,
            std::size_t iterations,
            TestFactory* testFactory,
            TestParametersDescriptor parameters
        )
        {
            // Determine if the test has been disabled.
            static const char* disabledPrefix = "DISABLED_";
            bool isDisabled = ((::strlen(testName) >= 9) &&
                               (!::memcmp(testName, disabledPrefix, 9)));

            if (isDisabled)
                testName += 9;

            // Add the descriptor.
            TestDescriptor* descriptor = new TestDescriptor(fixtureName,
                                                            testName,
                                                            runs,
                                                            iterations,
                                                            testFactory,
                                                            parameters,
                                                            isDisabled);

            Instance()._tests.push_back(descriptor);

            return descriptor;
        }